

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_eval.c
# Opt level: O1

boolean l2_absorb_expr_lshift_rshift_rshift_unsigned1(void)

{
  boolean bVar1;
  
  do {
    bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_LSHIFT);
    if (((bVar1 == '\0') &&
        (bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_RSHIFT), bVar1 == '\0')) &&
       (bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_RSHIFT_UNSIGNED), bVar1 == '\0')) {
      return '\x01';
    }
    l2_parse_token_forward();
    bVar1 = l2_absorb_expr_single();
    if (bVar1 == '\0') {
      return '\0';
    }
    bVar1 = l2_absorb_expr_mul_div_mod1();
  } while ((bVar1 != '\0') && (bVar1 = l2_absorb_expr_plus_sub1(), bVar1 != '\0'));
  return '\0';
}

Assistant:

boolean l2_absorb_expr_lshift_rshift_rshift_unsigned1() {
    _if_type (L2_TOKEN_LSHIFT)
    {
        return l2_absorb_expr_plus_sub() ? l2_absorb_expr_lshift_rshift_rshift_unsigned1() : L2_FALSE;
    }
    _elif_type (L2_TOKEN_RSHIFT)
    {
        return l2_absorb_expr_plus_sub() ? l2_absorb_expr_lshift_rshift_rshift_unsigned1() : L2_FALSE;
    }
    _elif_type (L2_TOKEN_RSHIFT_UNSIGNED)
    {
        return l2_absorb_expr_plus_sub() ? l2_absorb_expr_lshift_rshift_rshift_unsigned1() : L2_FALSE;
    }
    _end

    return L2_TRUE;
}